

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void costly_tin(char *verb)

{
  boolean bVar1;
  char *local_18;
  char *verb_local;
  
  if (((((tin.tin)->where != '\x03') &&
       (bVar1 = costly_spot((tin.tin)->ox,(tin.tin)->oy), bVar1 != '\0')) &&
      ((*(uint *)&(tin.tin)->field_0x4a >> 3 & 1) == 0)) ||
     ((*(uint *)&(tin.tin)->field_0x4a >> 2 & 1) != 0)) {
    local_18 = verb;
    if (verb == (char *)0x0) {
      local_18 = "open";
    }
    verbalize("You %s it, you bought it!",local_18);
    if (1 < (tin.tin)->quan) {
      tin.tin = splitobj(tin.tin,1);
    }
    bill_dummy_object(tin.tin);
  }
  return;
}

Assistant:

static void costly_tin(
    const char *verb /* if 0, the verb is "open" */)
{
	if (((!carried(tin.tin) &&
	     costly_spot(tin.tin->ox, tin.tin->oy) &&
	     !tin.tin->no_charge)
	    || tin.tin->unpaid)) {
	    verbalize("You %s it, you bought it!", verb ? verb : "open");
	    if (tin.tin->quan > 1L) tin.tin = splitobj(tin.tin, 1L);
	    bill_dummy_object(tin.tin);
	}
}